

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O1

char * Json_ReadPreprocess(char *pIn,int nFileSize)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pcVar2 = (char *)malloc((long)(nFileSize * 3));
  uVar5 = 0;
  if (0 < nFileSize) {
    uVar6 = 0;
    do {
      bVar1 = pIn[uVar6];
      iVar3 = (int)uVar5;
      if ((bVar1 - 0x5b < 0x23) && ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)) {
        pcVar2[iVar3] = ' ';
        pcVar2[(long)iVar3 + 1] = bVar1;
        uVar4 = iVar3 + 3;
        pcVar2[(long)iVar3 + 2] = ' ';
      }
      else {
        uVar4 = iVar3 + 1;
        pcVar2[iVar3] = bVar1;
      }
      uVar5 = (ulong)uVar4;
      uVar6 = uVar6 + 1;
    } while ((uint)nFileSize != uVar6);
    uVar5 = (ulong)(int)uVar4;
  }
  pcVar2[uVar5] = '\0';
  return pcVar2;
}

Assistant:

char * Json_ReadPreprocess( char * pIn, int nFileSize )
{
    char * pOut = ABC_ALLOC( char, 3*nFileSize ); int i, k = 0;
    for ( i = 0; i < nFileSize; i++ )
        if ( pIn[i] == '{' || pIn[i] == '}' || pIn[i] == '[' || pIn[i] == ']' )
        {
            pOut[k++] = ' ';
            pOut[k++] = pIn[i];
            pOut[k++] = ' ';
        }
        else
            pOut[k++] = pIn[i];
    pOut[k++] = '\0';
    return pOut;
}